

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_benchmark.c
# Opt level: O1

int main(void)

{
  ushort uVar1;
  uint *puVar2;
  bool bVar3;
  uint uVar4;
  run_container_t *prVar5;
  ulong uVar6;
  rle16_t *prVar7;
  void *pvVar8;
  undefined4 extraout_var;
  run_container_t *prVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte bVar10;
  ulong uVar11;
  run_container_t *prVar12;
  int card_1;
  int iVar13;
  ulong extraout_RDX;
  long lVar14;
  int card;
  int x_1;
  int iVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int i_1;
  ushort uVar22;
  int x;
  int iVar23;
  int i;
  int iVar24;
  long lVar25;
  bool bVar26;
  rle16_t rVar27;
  float fVar28;
  timespec ts;
  timespec local_78;
  run_container_t *local_68;
  run_container_t *local_60;
  ulong local_58;
  run_container_t *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  puVar2 = (uint *)cpuid_Version_info(1);
  uVar11 = (ulong)puVar2[3];
  uVar4 = *puVar2 >> 4;
  if (uVar4 < 0x406c) {
    if (uVar4 < 0x2065) {
      if (uVar4 < 0x266) {
        if (uVar4 < 0x6d) {
          uVar11 = (ulong)(uVar4 - 99);
          if (uVar4 - 99 < 2) {
            pcVar16 = "Prescott";
            goto LAB_00101557;
          }
          if (uVar4 == 0x66) {
            pcVar16 = "Presler";
            goto LAB_00101557;
          }
        }
        else {
          if (uVar4 == 0x6d) {
            pcVar16 = "Dothan";
            goto LAB_00101557;
          }
          if (uVar4 == 0x6f) goto switchD_00101304_caseD_0;
          if (uVar4 == 0x16c) {
            pcVar16 = "Pineview";
            goto LAB_00101557;
          }
        }
      }
      else {
        uVar6 = (ulong)(uVar4 - 0x1066);
        if (uVar4 - 0x1066 < 9) {
          uVar11 = (long)&switchD_00101304::switchdataD_00105030 +
                   (long)(int)(&switchD_00101304::switchdataD_00105030)[uVar6];
          switch(uVar6) {
          case 0:
switchD_00101304_caseD_0:
            pcVar16 = "Merom";
            goto LAB_00101557;
          case 1:
          case 7:
            pcVar16 = "Penryn";
            goto LAB_00101557;
          case 4:
          case 8:
switchD_00101304_caseD_4:
            pcVar16 = "Nehalem";
            goto LAB_00101557;
          }
        }
        else {
          uVar11 = uVar6;
          if (uVar4 == 0x266) {
            pcVar16 = "Lincroft";
            goto LAB_00101557;
          }
          if (uVar4 == 0x366) {
            pcVar16 = "Cedarview";
            goto LAB_00101557;
          }
        }
      }
    }
    else if (uVar4 < 0x306a) {
      uVar4 = uVar4 - 0x2065;
      if (uVar4 < 0xb) {
        uVar11 = 0x481;
        if ((0x481U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar16 = "Westmere";
          goto LAB_00101557;
        }
        uVar11 = 0x120;
        if ((0x120U >> (uVar4 & 0x1f) & 1) != 0) {
          pcVar16 = "SandyBridge";
          goto LAB_00101557;
        }
        if (uVar4 == 9) goto switchD_00101304_caseD_4;
      }
    }
    else if (uVar4 < 0x306d) {
      if (uVar4 == 0x306a) {
        pcVar16 = "IvyBridge";
        goto LAB_00101557;
      }
      if (uVar4 == 0x306c) {
        pcVar16 = "Haswell";
        goto LAB_00101557;
      }
    }
    else {
      if (uVar4 == 0x306d) {
        pcVar16 = "Broadwell";
        goto LAB_00101557;
      }
      if (uVar4 == 0x30f1) goto LAB_001014ea;
    }
  }
  else if (uVar4 < 0x9067) {
    if (uVar4 < 0x706a) {
      if (uVar4 < 0x606a) {
        if (uVar4 == 0x406c) {
          pcVar16 = "CherryTrail";
          goto LAB_00101557;
        }
        if (uVar4 == 0x506c) goto LAB_0010148a;
        if (uVar4 == 0x506e) {
          pcVar16 = "Skylake";
          goto LAB_00101557;
        }
      }
      else {
        if (uVar4 == 0x606a) {
LAB_00101496:
          pcVar16 = "Icelake";
          goto LAB_00101557;
        }
        if ((uVar4 == 0x60f0) || (uVar4 == 0x60f8)) {
LAB_001014ea:
          pcVar16 = "Zen2";
          goto LAB_00101557;
        }
      }
    }
    else if (uVar4 < 0x806c) {
      if (uVar4 == 0x706a) {
LAB_0010148a:
        pcVar16 = "Goldmont";
        goto LAB_00101557;
      }
      if (uVar4 == 0x706e) goto LAB_00101496;
      if (uVar4 == 0x70f1) goto LAB_001014ea;
    }
    else {
      uVar11 = (ulong)(uVar4 - 0x806c);
      if (uVar4 - 0x806c < 2) {
        pcVar16 = "TigerLake";
        goto LAB_00101557;
      }
      if (uVar4 == 0x806e) {
LAB_001014fa:
        pcVar16 = "Kabylake";
        goto LAB_00101557;
      }
    }
  }
  else if (uVar4 < 0xa067) {
    if (uVar4 < 0x90f0) {
      if ((uVar4 == 0x9067) || (uVar4 == 0x906a)) {
        pcVar16 = "Alderlake";
        goto LAB_00101557;
      }
      if (uVar4 == 0x906e) goto LAB_001014fa;
    }
    else {
      uVar11 = (ulong)(uVar4 - 0xa065);
      if (uVar4 - 0xa065 < 2) {
        pcVar16 = "Cometlake";
        goto LAB_00101557;
      }
      if (uVar4 == 0x90f0) goto LAB_001014ea;
    }
  }
  else if (uVar4 < 0x40f40) {
    if (uVar4 == 0xa067) {
      pcVar16 = "Rocketlake";
      goto LAB_00101557;
    }
    if (uVar4 == 0xb067) {
      pcVar16 = "Raptorlake";
      goto LAB_00101557;
    }
    if (uVar4 == 0x20f10) goto LAB_001014a2;
  }
  else {
    if (uVar4 == 0x40f40) {
      pcVar16 = "Zen3+";
      goto LAB_00101557;
    }
    if (uVar4 == 0x50f00) {
LAB_001014a2:
      pcVar16 = "Zen3";
      goto LAB_00101557;
    }
    if (uVar4 == 0x60f10) {
      pcVar16 = "Zen4";
      goto LAB_00101557;
    }
  }
  pcVar16 = "unknown";
LAB_00101557:
  iVar24 = 0;
  printf("x64 processor:  %s\t",pcVar16,(ulong)puVar2[2],uVar11);
  printf(" compiler version: %s\t",
         "Clang 19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
        );
  putchar(10);
  lVar25 = cpuid(0x80000006);
  if ((char)*(undefined4 *)(lVar25 + 0xc) != '@') {
    lVar25 = cpuid(0x80000006);
    printf("cache line: %d bytes\n",(ulong)(byte)*(uint *)(lVar25 + 0xc),
           (ulong)*(uint *)(lVar25 + 8),(ulong)*(uint *)(lVar25 + 0xc));
  }
  puts("run container benchmarks");
  prVar5 = run_container_create();
  printf("%s: ","add_test(B)");
  fflush((FILE *)0x0);
  uVar11 = 0xffffffffffffffff;
  do {
    clock_gettime(3,&local_78);
    lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
    local_68 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
    uVar4 = 0xfffffffd;
    do {
      uVar4 = uVar4 + 3;
      run_container_add(prVar5,(uint16_t)uVar4);
    } while (uVar4 < 0xfffd);
    clock_gettime(3,&local_78);
    uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000 +
            (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_68);
    if (uVar6 < uVar11) {
      uVar11 = uVar6;
    }
    iVar24 = iVar24 + 1;
  } while (iVar24 != 500);
  printf(" %.2f cycles per operation",(double)((float)uVar11 * 0.00048828125));
  putchar(10);
  iVar23 = 0;
  fflush((FILE *)0x0);
  prVar7 = prVar5->runs;
  iVar24 = 0;
  uVar11 = extraout_RDX;
  do {
    uVar4 = 0;
    iVar13 = prVar5->n_runs + -1;
    do {
      if (iVar13 < (int)uVar4) {
        uVar11 = (ulong)~uVar4;
        break;
      }
      uVar19 = uVar4 + iVar13 >> 1;
      if (prVar7[uVar19].value < (ushort)iVar23) {
        uVar4 = uVar19 + 1;
        bVar26 = true;
      }
      else if ((ushort)iVar23 < prVar7[uVar19].value) {
        iVar13 = uVar19 - 1;
        bVar26 = true;
      }
      else {
        bVar26 = false;
        uVar11 = (ulong)uVar19;
      }
    } while (bVar26);
    iVar15 = 1;
    iVar13 = (int)uVar11;
    if ((iVar13 < 0) &&
       ((iVar13 == -1 ||
        (uVar11 = (ulong)prVar7[-iVar13 - 2U].length,
        (int)(uint)prVar7[-iVar13 - 2U].length < (int)(iVar23 - (uint)prVar7[-iVar13 - 2U].value))))
       ) {
      iVar15 = 0;
    }
    iVar24 = iVar24 + iVar15;
    iVar23 = iVar23 + 1;
  } while (iVar23 != 0x10000);
  bVar26 = false;
  printf("%s: ","contains_test(B)");
  fflush((FILE *)0x0);
  uVar11 = 0xffffffffffffffff;
  iVar23 = 0;
  do {
    uVar6 = 3;
    clock_gettime(3,&local_78);
    local_60 = (run_container_t *)CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
    local_68 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
    prVar7 = prVar5->runs;
    iVar15 = 0;
    iVar13 = 0;
    do {
      uVar4 = 0;
      iVar21 = prVar5->n_runs + -1;
      do {
        if (iVar21 < (int)uVar4) {
          uVar6 = (ulong)~uVar4;
          break;
        }
        uVar19 = uVar4 + iVar21 >> 1;
        if (prVar7[uVar19].value < (ushort)iVar15) {
          uVar4 = uVar19 + 1;
          bVar3 = true;
        }
        else if ((ushort)iVar15 < prVar7[uVar19].value) {
          iVar21 = uVar19 - 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          uVar6 = (ulong)uVar19;
        }
      } while (bVar3);
      iVar20 = 1;
      iVar21 = (int)uVar6;
      if ((iVar21 < 0) &&
         ((iVar21 == -1 ||
          (uVar6 = (ulong)prVar7[-iVar21 - 2U].length,
          (int)(uint)prVar7[-iVar21 - 2U].length < (int)(iVar15 - (uint)prVar7[-iVar21 - 2U].value))
          ))) {
        iVar20 = 0;
      }
      iVar13 = iVar13 + iVar20;
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0x10000);
    if (iVar13 != iVar24) {
      bVar26 = true;
    }
    clock_gettime(3,&local_78);
    uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - (long)local_60) * 1000000000 +
            (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_68);
    if (uVar6 < uVar11) {
      uVar11 = uVar6;
    }
    iVar23 = iVar23 + 1;
  } while (iVar23 != 500);
  printf(" %.2f cycles per operation",(double)((float)uVar11 * 1.5258789e-05));
  if (bVar26) {
    printf(" [ERROR]");
  }
  putchar(10);
  uVar11 = 0;
  fflush((FILE *)0x0);
  printf("%s: ","remove_test(B)");
  fflush((FILE *)0x0);
  prVar12 = (run_container_t *)0xffffffffffffffff;
  uVar4 = 500;
  do {
    local_68 = (run_container_t *)uVar11;
    local_60 = prVar12;
    clock_gettime(3,&local_78);
    local_58 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
    local_50 = (run_container_t *)CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
    uVar19 = 0;
    do {
      prVar7 = prVar5->runs;
      iVar23 = prVar5->n_runs;
      iVar24 = iVar23 + -1;
      uVar18 = 0;
      do {
        uVar22 = (ushort)uVar19;
        if (iVar24 < (int)uVar18) {
          uVar4 = ~uVar18;
          break;
        }
        uVar17 = uVar18 + iVar24 >> 1;
        if (prVar7[uVar17].value < uVar22) {
          uVar18 = uVar17 + 1;
          bVar26 = true;
        }
        else if (uVar22 < prVar7[uVar17].value) {
          iVar24 = uVar17 - 1;
          bVar26 = true;
        }
        else {
          bVar26 = false;
          uVar4 = uVar17;
        }
      } while (bVar26);
      if ((int)uVar4 < 0) {
        if (uVar4 != 0xffffffff) {
          uVar11 = (ulong)(-uVar4 - 2);
          uVar18 = uVar19 - prVar7[uVar11].value;
          uVar1 = prVar7[uVar11].length;
          if ((int)uVar18 < (int)(uint)uVar1) {
            prVar7[uVar11].length = (ushort)uVar18 - 1;
            if (prVar5->capacity <= iVar23) {
              run_container_grow(prVar5,iVar23 + 1,true);
            }
            uVar4 = ~uVar4;
            uVar11 = (ulong)(uVar4 & 0xffff);
            memmove(prVar5->runs + uVar11 + 1,prVar5->runs + uVar11,
                    ((long)prVar5->n_runs - uVar11) * 4);
            prVar5->n_runs = prVar5->n_runs + 1;
            prVar7 = prVar5->runs;
            uVar11 = (ulong)uVar4;
            prVar7[uVar11].value = uVar22 + 1;
            uVar22 = ~(ushort)uVar18;
          }
          else {
            if (uVar18 != uVar1) goto LAB_00101a44;
            uVar22 = 0xffff;
          }
          prVar7[uVar11].length = uVar1 + uVar22;
        }
      }
      else if (prVar7[uVar4].length == 0) {
        uVar18 = uVar4 & 0xffff;
        memmove(prVar7 + uVar18,prVar7 + (ulong)uVar18 + 1,(long)(int)(iVar23 + ~uVar18) << 2);
        prVar5->n_runs = prVar5->n_runs + -1;
      }
      else {
        rVar27.value = prVar7[uVar4].value + 1;
        rVar27.length = prVar7[uVar4].length - 1;
        prVar7[uVar4] = rVar27;
      }
LAB_00101a44:
      bVar26 = uVar19 < 0xfffd;
      uVar19 = uVar19 + 3;
    } while (bVar26);
    clock_gettime(3,&local_78);
    pvVar8 = (void *)((CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - local_58) * 1000000000
                     + (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - (long)local_50));
    prVar12 = local_60;
    if (pvVar8 < local_60) {
      prVar12 = (run_container_t *)pvVar8;
    }
    uVar19 = (int)local_68 + 1;
    uVar11 = (ulong)uVar19;
    if (uVar19 == 500) {
      printf(" %.2f cycles per operation",(double)((float)prVar12 / 21845.0));
      putchar(10);
      fflush((FILE *)0x0);
      run_container_free(prVar5);
      uVar11 = 0x20;
      do {
        prVar5 = run_container_create();
        local_50 = (run_container_t *)uVar11;
        do {
          uVar4 = (uint)(pcg32_global_0 >> 0x2d) ^ (uint)(pcg32_global_0 >> 0x1b);
          bVar10 = (byte)(pcg32_global_0 >> 0x3b);
          pcg32_global_0 = pcg32_global_0 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
          run_container_add(prVar5,(ushort)(uVar4 >> bVar10) | (ushort)(uVar4 << 0x20 - bVar10));
          uVar4 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar4;
        } while (uVar4 != 0);
        uVar4 = run_container_cardinality(prVar5);
        bVar26 = false;
        printf("\n number of values in container = %d\n",(ulong)uVar4);
        iVar24 = run_container_cardinality(prVar5);
        local_68 = (run_container_t *)CONCAT44(extraout_var,iVar24);
        local_58 = (ulong)iVar24;
        local_60 = (run_container_t *)malloc(local_58 * 4);
        printf("%s: ","run_container_to_uint32_array(out, Bt, 1234)");
        fflush((FILE *)0x0);
        iVar24 = 500;
        uVar11 = 0xffffffffffffffff;
        do {
          clock_gettime(3,&local_78);
          lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
          lVar14 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
          iVar23 = run_container_to_uint32_array(local_60,prVar5,0x4d2);
          if (iVar23 != (int)local_68) {
            bVar26 = true;
          }
          clock_gettime(3,&local_78);
          prVar12 = local_60;
          uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000 +
                  (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar14);
          if (uVar11 <= uVar6) {
            uVar6 = uVar11;
          }
          iVar24 = iVar24 + -1;
          uVar11 = uVar6;
        } while (iVar24 != 0);
        if ((long)local_58 < 0) {
          fVar28 = (float)((ulong)((uint)local_68 & 1) | local_58 >> 1);
          fVar28 = fVar28 + fVar28;
        }
        else {
          fVar28 = (float)(int)(uint)local_68;
        }
        printf(" %.2f cycles per operation",(double)((float)uVar6 / fVar28));
        if (bVar26) {
          printf(" [ERROR]");
        }
        putchar(10);
        iVar24 = 0;
        fflush((FILE *)0x0);
        free(prVar12);
        printf("%s %s: ","run_container_contains","run_cache_prefetch");
        fflush((FILE *)0x0);
        lVar25 = 0;
        do {
          lVar14 = cpuid(0x80000006);
          if (0 < prVar5->n_runs) {
            uVar11 = 0;
            do {
              uVar11 = uVar11 + (*(uint *)(lVar14 + 0xc) >> 1 & 0x7f);
            } while (uVar11 < (ulong)(uint)prVar5->n_runs * 2);
          }
          clock_gettime(3,&local_78);
          iVar13 = (int)local_78.tv_nsec;
          iVar23 = (int)local_78.tv_sec;
          clock_gettime(3,&local_78);
          iVar24 = ((int)local_78.tv_sec - iVar23) * 1000000000 +
                   iVar24 + ((int)local_78.tv_nsec - iVar13);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 0x400);
        printf(" %.2f cycles per operation",(double)((float)iVar24 * 0.0009765625));
        putchar(10);
        iVar24 = 0;
        fflush((FILE *)0x0);
        printf("%s %s: ","run_container_contains","run_cache_flush");
        fflush((FILE *)0x0);
        lVar25 = 0;
        do {
          lVar14 = cpuid(0x80000006);
          if (0 < prVar5->n_runs) {
            uVar4 = *(uint *)(lVar14 + 0xc) >> 1 & 0x7f;
            lVar14 = 0;
            iVar23 = 0;
            do {
              clflush(*(undefined1 *)((long)&prVar5->runs->value + lVar14));
              iVar23 = iVar23 + uVar4;
              lVar14 = lVar14 + (ulong)(uVar4 * 4);
            } while (iVar23 < prVar5->n_runs * 2);
          }
          clock_gettime(3,&local_78);
          iVar13 = (int)local_78.tv_nsec;
          iVar23 = (int)local_78.tv_sec;
          clock_gettime(3,&local_78);
          iVar24 = ((int)local_78.tv_sec - iVar23) * 1000000000 +
                   iVar24 + ((int)local_78.tv_nsec - iVar13);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 0x400);
        printf(" %.2f cycles per operation",(double)((float)iVar24 * 0.0009765625));
        putchar(10);
        fflush((FILE *)0x0);
        run_container_free(prVar5);
        uVar11 = (ulong)((uint)local_50 * 8);
      } while ((uint)local_50 < 0x2001);
      putchar(10);
      uVar4 = 0xfffffffd;
      local_68 = run_container_create();
      do {
        uVar4 = uVar4 + 3;
        run_container_add(local_68,(uint16_t)uVar4);
      } while (uVar4 < 0xfffd);
      uVar4 = 0xfffffffb;
      prVar5 = run_container_create();
      do {
        uVar4 = uVar4 + 5;
        run_container_add(prVar5,(uint16_t)uVar4);
      } while (uVar4 < 0xfffb);
      prVar9 = run_container_create();
      puts("\nUnion and intersections...");
      puts("\nNote:");
      puts("union times are expressed in cycles per number of input elements (both runs)");
      puts("intersection times are expressed in cycles per number of output elements\n");
      puts("==intersection and union test 1 ");
      prVar12 = local_68;
      uVar4 = run_container_cardinality(local_68);
      uVar19 = run_container_cardinality(prVar5);
      bVar26 = false;
      printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar4,(ulong)uVar19);
      run_container_union(prVar12,prVar5,prVar9);
      local_50 = prVar9;
      uVar4 = run_container_cardinality(prVar9);
      local_40 = CONCAT44(local_40._4_4_,uVar4);
      printf("union cardinality = %d \n",(ulong)uVar4);
      uVar4 = run_container_cardinality(prVar12);
      uVar19 = run_container_cardinality(prVar5);
      printf("B1 card = %d B2 card = %d \n",(ulong)uVar4,(ulong)uVar19);
      local_38 = (long)prVar12->n_runs;
      local_48 = (long)prVar5->n_runs;
      printf("%s: ","union_test(B1, B2, BO)");
      fflush((FILE *)0x0);
      prVar12 = local_50;
      iVar24 = 500;
      uVar11 = 0xffffffffffffffff;
      local_60 = prVar5;
      do {
        clock_gettime(3,&local_78);
        lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
        local_58 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
        run_container_union(local_68,local_60,prVar12);
        iVar23 = run_container_cardinality(prVar12);
        if (iVar23 != (int)local_40) {
          bVar26 = true;
        }
        clock_gettime(3,&local_78);
        prVar9 = local_50;
        prVar5 = local_60;
        uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000 +
                (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - local_58);
        if (uVar11 <= uVar6) {
          uVar6 = uVar11;
        }
        iVar24 = iVar24 + -1;
        uVar11 = uVar6;
      } while (iVar24 != 0);
      printf(" %.2f cycles per operation",
             (double)((float)uVar6 / (float)(ulong)(local_48 + local_38)));
      if (bVar26) {
        printf(" [ERROR]");
      }
      putchar(10);
      bVar26 = false;
      fflush((FILE *)0x0);
      run_container_intersection(local_68,prVar5,prVar9);
      uVar4 = run_container_cardinality(prVar9);
      local_58 = CONCAT44(extraout_var_00,uVar4);
      printf("intersection cardinality = %d \n",(ulong)uVar4);
      printf("%s: ","intersection_test(B1, B2, BO)");
      fflush((FILE *)0x0);
      prVar5 = local_50;
      iVar24 = 500;
      uVar11 = 0xffffffffffffffff;
      do {
        clock_gettime(3,&local_78);
        lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
        lVar14 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
        run_container_intersection(local_68,local_60,prVar5);
        iVar23 = run_container_cardinality(prVar5);
        if (iVar23 != (int)local_58) {
          bVar26 = true;
        }
        clock_gettime(3,&local_78);
        prVar12 = local_60;
        uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000 +
                (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar14);
        if (uVar11 <= uVar6) {
          uVar6 = uVar11;
        }
        iVar24 = iVar24 + -1;
        uVar11 = uVar6;
      } while (iVar24 != 0);
      uVar4 = (uint)local_58;
      if ((long)(int)uVar4 < 0) {
        fVar28 = (float)((ulong)(uVar4 & 1) | (ulong)(long)(int)uVar4 >> 1);
        fVar28 = fVar28 + fVar28;
      }
      else {
        fVar28 = (float)(int)uVar4;
      }
      printf(" %.2f cycles per operation",(double)((float)uVar6 / fVar28));
      if (bVar26) {
        printf(" [ERROR]");
      }
      putchar(10);
      uVar11 = 0;
      fflush((FILE *)0x0);
      puts("==intersection and union test 2 ");
      local_68->n_runs = 0;
      prVar12->n_runs = 0;
      do {
        uVar19 = (uint)uVar11;
        uVar4 = (int)(uVar11 / 0xb) + (int)(uVar11 / 0xb) * 10;
        if (uVar19 != uVar4) {
          uVar18 = 0;
          do {
            run_container_add(local_68,(short)uVar11 + (short)uVar18);
            uVar18 = uVar18 + 1;
          } while (uVar18 < uVar19 - uVar4);
        }
        uVar11 = (ulong)(uVar19 + 0x40);
      } while (uVar19 < 0xffc0);
      iVar24 = 1;
      do {
        run_container_add(prVar12,(uint16_t)iVar24);
        prVar5 = local_68;
        bVar26 = iVar24 < 0x8000;
        iVar24 = iVar24 * 2;
      } while (bVar26);
      uVar4 = run_container_cardinality(local_68);
      uVar19 = run_container_cardinality(prVar12);
      bVar26 = false;
      printf("input 1 cardinality = %d, input 2 cardinality = %d \n",(ulong)uVar4,(ulong)uVar19);
      prVar9 = local_50;
      run_container_union(prVar5,prVar12,local_50);
      uVar4 = run_container_cardinality(prVar9);
      local_58 = CONCAT44(local_58._4_4_,uVar4);
      printf("union cardinality = %d \n",(ulong)uVar4);
      uVar4 = run_container_cardinality(prVar5);
      uVar19 = run_container_cardinality(prVar12);
      printf("B1 card = %d B2 card = %d \n",(ulong)uVar4,(ulong)uVar19);
      local_48 = (long)prVar5->n_runs;
      local_40 = (long)prVar12->n_runs;
      printf("%s: ","union_test(B1, B2, BO)");
      fflush((FILE *)0x0);
      iVar24 = 500;
      uVar11 = 0xffffffffffffffff;
      do {
        clock_gettime(3,&local_78);
        prVar5 = local_50;
        lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
        lVar14 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
        run_container_union(local_68,local_60,local_50);
        iVar23 = run_container_cardinality(prVar5);
        if (iVar23 != (int)local_58) {
          bVar26 = true;
        }
        clock_gettime(3,&local_78);
        prVar12 = local_50;
        prVar5 = local_60;
        uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000 +
                (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar14);
        if (uVar11 <= uVar6) {
          uVar6 = uVar11;
        }
        iVar24 = iVar24 + -1;
        uVar11 = uVar6;
      } while (iVar24 != 0);
      printf(" %.2f cycles per operation",
             (double)((float)uVar6 / (float)(ulong)(local_40 + local_48)));
      if (bVar26) {
        printf(" [ERROR]");
      }
      putchar(10);
      bVar26 = false;
      fflush((FILE *)0x0);
      run_container_intersection(local_68,prVar5,prVar12);
      uVar4 = run_container_cardinality(prVar12);
      local_58 = CONCAT44(extraout_var_01,uVar4);
      printf("intersection cardinality = %d \n",(ulong)uVar4);
      printf("%s: ","intersection_test(B1, B2, BO)");
      fflush((FILE *)0x0);
      prVar5 = local_50;
      iVar24 = 500;
      uVar11 = 0xffffffffffffffff;
      do {
        clock_gettime(3,&local_78);
        lVar25 = CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec);
        lVar14 = CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec);
        run_container_intersection(local_68,local_60,prVar5);
        iVar23 = run_container_cardinality(prVar5);
        if (iVar23 != (int)local_58) {
          bVar26 = true;
        }
        clock_gettime(3,&local_78);
        prVar12 = local_60;
        uVar6 = (CONCAT44(local_78.tv_sec._4_4_,(int)local_78.tv_sec) - lVar25) * 1000000000 +
                (CONCAT44(local_78.tv_nsec._4_4_,(int)local_78.tv_nsec) - lVar14);
        if (uVar11 <= uVar6) {
          uVar6 = uVar11;
        }
        iVar24 = iVar24 + -1;
        uVar11 = uVar6;
      } while (iVar24 != 0);
      uVar4 = (uint)local_58;
      if ((long)(int)uVar4 < 0) {
        fVar28 = (float)((ulong)(uVar4 & 1) | (ulong)(long)(int)uVar4 >> 1);
        fVar28 = fVar28 + fVar28;
      }
      else {
        fVar28 = (float)(int)uVar4;
      }
      printf(" %.2f cycles per operation",(double)((float)uVar6 / fVar28));
      if (bVar26) {
        printf(" [ERROR]");
      }
      putchar(10);
      fflush((FILE *)0x0);
      run_container_free(local_68);
      run_container_free(prVar12);
      run_container_free(local_50);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    int repeat = 500;
    int size = TESTSIZE;
    tellmeall();
    printf("run container benchmarks\n");
    run_container_t* B = run_container_create();
    BEST_TIME(add_test(B), 0, repeat, size);
    int answer = contains_test(B);
    size = 1 << 16;
    BEST_TIME(contains_test(B), answer, repeat, size);
    size = (1 << 16) / 3;
    BEST_TIME(remove_test(B), 0, repeat, size);
    run_container_free(B);

    for (int howmany = 32; howmany <= (1 << 16); howmany *= 8) {
        run_container_t* Bt = run_container_create();
        for (int j = 0; j < howmany; ++j) {
            run_container_add(Bt, (uint16_t)pcg32_random());
        }
        size_t nbrtestvalues = 1024;
        uint16_t* testvalues = malloc(nbrtestvalues * sizeof(uint16_t));
        printf("\n number of values in container = %d\n",
               run_container_cardinality(Bt));
        int card = run_container_cardinality(Bt);
        uint32_t* out = malloc(sizeof(uint32_t) * (unsigned long)card);
        BEST_TIME(run_container_to_uint32_array(out, Bt, 1234), card, repeat,
                  card);
        free(out);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_prefetch,
                            testvalues, nbrtestvalues);
        BEST_TIME_PRE_ARRAY(Bt, run_container_contains, run_cache_flush,
                            testvalues, nbrtestvalues);
        free(testvalues);
        run_container_free(Bt);
    }
    printf("\n");

    run_container_t* B1 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 3) {
        run_container_add(B1, (uint16_t)x);
    }
    run_container_t* B2 = run_container_create();
    for (int x = 0; x < 1 << 16; x += 5) {
        run_container_add(B2, (uint16_t)x);
    }
    int32_t inputsize;
    inputsize = B1->n_runs + B2->n_runs;
    run_container_t* BO = run_container_create();
    printf("\nUnion and intersections...\n");
    printf("\nNote:\n");
    printf(
        "union times are expressed in cycles per number of input elements "
        "(both runs)\n");
    printf(
        "intersection times are expressed in cycles per number of output "
        "elements\n\n");
    printf("==intersection and union test 1 \n");
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;
    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);
    printf("==intersection and union test 2 \n");
    B1->n_runs = 0;
    B2->n_runs = 0;
    for (int x = 0; x < (1 << 16); x += 64) {
        int length = x % 11;
        for (int y = 0; y < length; ++y)
            run_container_add(B1, (uint16_t)(x + y));
    }
    for (int x = 1; x < 1 << 16; x += x) {
        run_container_add(B2, (uint16_t)x);
    }
    printf("input 1 cardinality = %d, input 2 cardinality = %d \n",
           run_container_cardinality(B1), run_container_cardinality(B2));
    answer = union_test(B1, B2, BO);
    printf("union cardinality = %d \n", answer);
    printf("B1 card = %d B2 card = %d \n", run_container_cardinality(B1),
           run_container_cardinality(B2));
    inputsize = B1->n_runs + B2->n_runs;

    BEST_TIME(union_test(B1, B2, BO), answer, repeat, inputsize);
    answer = intersection_test(B1, B2, BO);
    printf("intersection cardinality = %d \n", answer);
    BEST_TIME(intersection_test(B1, B2, BO), answer, repeat, answer);

    run_container_free(B1);
    run_container_free(B2);
    run_container_free(BO);
    return 0;
}